

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t coda_strnspn(char *s,char *n,size_t len)

{
  char *x;
  char *e;
  char *p;
  size_t len_local;
  char *n_local;
  char *s_local;
  
  for (p = s; x = n, p < s + len; p = p + 1) {
    for (; (*x != '\0' && (*p != *x)); x = x + 1) {
    }
    if (*x == '\0') break;
  }
  return (long)p - (long)s;
}

Assistant:

size_t coda_strnspn(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) break;
		}

		if (!*x) break;
	}

	return p - s;
}